

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  ulong uVar1;
  uint uVar2;
  Bool BVar3;
  int iVar4;
  byte *pbStack_40;
  uint wraplen;
  tmbstr s;
  tchar c;
  Bool xmlOut;
  Bool xhtmlOut;
  Bool uc;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  _xhtmlOut = &doc->pprint;
  xmlOut = (Bool)(doc->config).value[0x55].v;
  c = (tchar)(doc->config).value[0x62].v;
  s._4_4_ = (int)(doc->config).value[100].v;
  pbStack_40 = (byte *)node->element;
  pprint = (TidyPrintImpl *)node;
  node_local._0_4_ = indent;
  node_local._4_4_ = mode;
  _indent_local = doc;
  AddChar(_xhtmlOut,0x3c);
  if (pprint[1].lbufsize == 6) {
    AddChar(_xhtmlOut,0x2f);
  }
  if (pbStack_40 != (byte *)0x0) {
    for (; *pbStack_40 != 0; pbStack_40 = pbStack_40 + 1) {
      s._0_4_ = (uint)*pbStack_40;
      if ((uint)s < 0x80) {
        if (xmlOut != no) {
          s._0_4_ = prvTidyToUpper((uint)s);
        }
      }
      else {
        uVar2 = prvTidyGetUTF8((ctmbstr)pbStack_40,(uint *)&s);
        pbStack_40 = pbStack_40 + uVar2;
      }
      AddChar(_xhtmlOut,(uint)s);
    }
  }
  PPrintAttrs(_indent_local,(uint)node_local,(Node *)pprint);
  if (((s._4_4_ != 0) || (c != 0)) &&
     ((pprint[1].lbufsize == 7 || (BVar3 = prvTidynodeCMIsEmpty((Node *)pprint), BVar3 != no)))) {
    AddChar(_xhtmlOut,0x20);
    AddChar(_xhtmlOut,0x2f);
  }
  AddChar(_xhtmlOut,0x3e);
  if (((pprint[1].lbufsize == 7) && (iVar4 = prvTidyHTMLVersion(_indent_local), iVar4 == 0x20000))
     && (BVar3 = prvTidynodeHasCM((Node *)pprint,0x400000), BVar3 == no)) {
    PPrintEndTag(_indent_local,node_local._4_4_,(uint)node_local,(Node *)pprint);
  }
  if ((((pprint[1].lbufsize != 7) || (c != 0)) ||
      ((pprint[1].lbufsize == 7 && (iVar4 = prvTidyHTMLVersion(_indent_local), iVar4 == 0x20000))))
     && ((node_local._4_4_ & 1) == 0)) {
    uVar1 = (_indent_local->config).value[0x5d].v;
    CheckWrapIndent(_indent_local,(uint)node_local);
    if ((uint)node_local + _xhtmlOut->linelen < (uint)uVar1) {
      if (((node_local._4_4_ & 8) == 0) &&
         (((BVar3 = prvTidynodeCMIsInline((Node *)pprint), BVar3 == no ||
           (((pprint != (TidyPrintImpl *)0x0 && (*(long *)&pprint->indent[1].attrStringStart != 0))
            && (**(int **)&pprint->indent[1].attrStringStart == 0x11)))) &&
          (BVar3 = AfterSpace(_indent_local->lexer,(Node *)pprint), BVar3 != no)))) {
        _xhtmlOut->wraphere = _xhtmlOut->linelen;
      }
    }
    else if ((((node_local._4_4_ & 8) != 0) ||
             (((pprint != (TidyPrintImpl *)0x0 && (*(long *)&pprint->indent[1].attrStringStart != 0)
               ) && (**(int **)&pprint->indent[1].attrStringStart == 0x11)))) ||
            (BVar3 = AfterSpace(_indent_local->lexer,(Node *)pprint), BVar3 != no)) {
      PCondFlushLineSmart(_indent_local,(uint)node_local);
    }
  }
  return;
}

Assistant:

static void PPrintTag( TidyDocImpl* doc,
                       uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Bool xmlOut = cfgBool( doc, TidyXmlOut );
    tchar c;
    tmbstr s = node->element;

    AddChar( pprint, '<' );

    if ( node->type == EndTag )
        AddChar( pprint, '/' );

    if (s)
    {
        while (*s)
        {
            c = (unsigned char)*s;

            if (c > 0x7F)
                s += TY_(GetUTF8)(s, &c);
            else if (uc)
                c = TY_(ToUpper)(c);

            AddChar(pprint, c);
            ++s;
        }
    }

    PPrintAttrs( doc, indent, node );

    if ( (xmlOut || xhtmlOut) &&
         (node->type == StartEndTag || TY_(nodeCMIsEmpty)(node)) )
    {
        AddChar( pprint, ' ' );   /* Space is NS compatibility hack <br /> */
        AddChar( pprint, '/' );   /* Required end tag marker */
    }

    AddChar( pprint, '>' );

    /*\
     *  Appears this was added for Issue #111, #112, #113, but will now add an end tag
     *  for elements like <img ...> which do NOT have an EndTag, even in html5
     *  See Issue #162 - void elements also get a closing tag, like img, br, ...
     *  A complete list of the void elements in HTML.
     *  area, base, br, col, command, embed, hr, img, input, keygen, link, meta, param, source, track, wbr
     *  A new CM_VOID was added to tag_defs[] to account for these.
    \*/
    if ((node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50) && !TY_(nodeHasCM)(node, CM_VOID ) )
    {
        PPrintEndTag( doc, mode, indent, node );
    }

    if ( (node->type != StartEndTag || xhtmlOut || (node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50)) && !(mode & PREFORMATTED) )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        CheckWrapIndent( doc, indent );

        if ( indent + pprint->linelen < wraplen )
        {
            /* wrap after start tag if is <br/> or if it's not inline.
               Technically, it would be safe to call only AfterSpace.
               However, it would disrupt the existing algorithm. So let's
               leave as is. Note that AfterSpace returns true for non inline
               elements but can still be false for some <br>. So it has to
               stay as well. */
            if (!(mode & NOWRAP)
                && (!TY_(nodeCMIsInline)(node) || nodeIsBR(node))
                && AfterSpace(doc->lexer, node))
            {
                pprint->wraphere = pprint->linelen;
            }
        }
        /* flush the current buffer only if it is known to be safe,
           i.e. it will not introduce some spurious white spaces.
           See bug #996484 */
        else if ( mode & NOWRAP ||
                  nodeIsBR(node) || AfterSpace(doc->lexer, node))
            PCondFlushLineSmart( doc, indent );
    }
}